

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall Board::set_position(Board *this,Ship *ship)

{
  reference pvVar1;
  reference pvVar2;
  int local_28;
  int local_24;
  int i_1;
  int i;
  int j_1;
  int j;
  Ship *ship_local;
  Board *this_local;
  
  if ((ship->length == 1) && (ship->ID == 'S')) {
    pvVar1 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&this->matrix,(long)ship->sRow);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar1,(long)ship->sCol);
    std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f0b);
  }
  if (ship->orientation == 'H') {
    if (ship->direction == 1) {
      for (i = ship->sCol; i < ship->sCol + ship->length; i = i + 1) {
        if (i == ship->sCol) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)ship->sRow);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)i);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f21);
        }
        else if (i == ship->sCol + ship->length + -1) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)ship->sRow);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)i);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f2b);
        }
        else {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)ship->sRow);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)i);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f35);
        }
      }
    }
    else if (ship->direction == -1) {
      for (i_1 = ship->sCol; ship->sCol - ship->length < i_1; i_1 = i_1 + -1) {
        if (i_1 == ship->sCol) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)ship->sRow);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)i_1);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f2b);
        }
        else if (i_1 == ship->sCol - (ship->length + -1)) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)ship->sRow);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)i_1);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f21);
        }
        else {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)ship->sRow);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)i_1);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f35);
        }
      }
    }
  }
  else if (ship->orientation == 'V') {
    if (ship->direction == 2) {
      for (local_24 = ship->sRow; local_24 < ship->sRow + ship->length; local_24 = local_24 + 1) {
        if (local_24 == ship->sRow) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)local_24);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)ship->sCol);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f3f);
        }
        else if (local_24 == ship->sRow + ship->length + -1) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)local_24);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)ship->sCol);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f49);
        }
        else {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)local_24);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)ship->sCol);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f35);
        }
      }
    }
    else if (ship->direction == -2) {
      for (local_28 = ship->sRow; ship->sRow - ship->length < local_28; local_28 = local_28 + -1) {
        if (local_28 == ship->sRow) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)local_28);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)ship->sCol);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f49);
        }
        else if (local_28 == ship->sRow - (ship->length + -1)) {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)local_28);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)ship->sCol);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f3f);
        }
        else {
          pvVar1 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->matrix,(long)local_28);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvVar1,(long)ship->sCol);
          std::__cxx11::string::operator=((string *)pvVar2,anon_var_dwarf_3f35);
        }
      }
    }
  }
  return;
}

Assistant:

void set_position( Ship *ship )
        {
            if( ship->length == 1 and ship->ID == 'S')
            {
                matrix[ship->sRow][ship->sCol] = "⬤";
            }

            if( ship->orientation == 'H' )
            {
                if( ship->direction == 1 )
                {
                    for( int j = ship->sCol; j < ship->sCol + ship->length; j++ )
                    {
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else if( j == ship->sCol + ship->length - 1 )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
                else if( ship->direction == -1 )
                { 
                    for( int j = ship->sCol; j > ship->sCol - ship->length; j-- )
                    { 
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else if( j == ship->sCol - ( ship->length - 1 ) )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
            }
            else if( ship->orientation == 'V' )
            {
                if( ship->direction == 2 )
                {
                    for( int i = ship->sRow; i < ship->sRow + ship->length; i++ )
                    {
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else if( i == ship->sRow + ship->length - 1 )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
                else if( ship->direction == -2 )
                {
                    for( int i = ship->sRow; i > ship->sRow - ship->length; i-- )
                    { 
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else if( i == ship->sRow - ( ship->length - 1 ) )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
             }
        }